

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O2

unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
__thiscall duckdb::ColumnCountScanner::UpgradeToStringValueScanner(ColumnCountScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar1;
  CSVStateMachine *pCVar2;
  CSVStateMachine *pCVar3;
  bool *args_5;
  ulong rows_to_skip;
  long in_RSI;
  bool *args;
  CSVIterator *args_4;
  CSVIterator *this_01;
  bool local_dd;
  bool local_dc [4];
  undefined1 local_d8 [24];
  CSVIterator iterator;
  CSVIterator it;
  
  this_00 = (shared_ptr<duckdb::CSVStateMachine,_true> *)(in_RSI + 0x30);
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  uVar1 = (pCVar2->dialect_options).skip_rows.value;
  rows_to_skip = (pCVar3->dialect_options).rows_until_header;
  if (rows_to_skip < uVar1) {
    rows_to_skip = uVar1;
  }
  ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),
             (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x48));
  BaseScanner::SkipCSVRows
            (&iterator,(shared_ptr<duckdb::CSVBufferManager,_true> *)(local_d8 + 8),this_00,
             rows_to_skip);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x10));
  if (iterator.done == true) {
    this_01 = &it;
    CSVIterator::CSVIterator(this_01);
    args = local_dc;
    local_dc[0] = false;
    local_dc[1] = false;
    local_dc[2] = false;
    local_dc[3] = false;
    args_4 = (CSVIterator *)local_d8;
    local_d8._0_8_ = 0;
    args_5 = &local_dd;
    local_dd = true;
  }
  else {
    args = (bool *)local_d8;
    local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
    args_4 = &it;
    it.pos.buffer_idx = 0;
    args_5 = local_dc;
    local_dc[0] = true;
    this_01 = &iterator;
  }
  make_uniq<duckdb::StringValueScanner,unsigned_int,duckdb::shared_ptr<duckdb::CSVBufferManager,true>&,duckdb::shared_ptr<duckdb::CSVStateMachine,true>&,duckdb::shared_ptr<duckdb::CSVErrorHandler,true>&,decltype(nullptr),bool,duckdb::CSVIterator&,unsigned_long&>
            ((duckdb *)this,(uint *)args,
             (shared_ptr<duckdb::CSVBufferManager,_true> *)(in_RSI + 0x48),this_00,
             (shared_ptr<duckdb::CSVErrorHandler,_true> *)(in_RSI + 0x20),(void **)args_4,args_5,
             this_01,(unsigned_long *)(in_RSI + 0x1c8));
  return (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
         (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
         this;
}

Assistant:

unique_ptr<StringValueScanner> ColumnCountScanner::UpgradeToStringValueScanner() {
	idx_t rows_to_skip =
	    std::max(state_machine->dialect_options.skip_rows.GetValue(), state_machine->dialect_options.rows_until_header);
	auto iterator = SkipCSVRows(buffer_manager, state_machine, rows_to_skip);
	if (iterator.done) {
		CSVIterator it {};
		return make_uniq<StringValueScanner>(0U, buffer_manager, state_machine, error_handler, nullptr, true, it,
		                                     result_size);
	}
	return make_uniq<StringValueScanner>(0U, buffer_manager, state_machine, error_handler, nullptr, true, iterator,
	                                     result_size);
}